

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShapeAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::ShapeAtomTypesSectionParser::parseLine
          (ShapeAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  AtomType *pAVar2;
  size_t sVar3;
  uint in_ECX;
  string *in_RDX;
  int ident;
  AtomType *atomType;
  string shapeFile;
  string shapeTypeName;
  StringTokenizer tokenizer;
  AtomType *in_stack_00010878;
  string *in_stack_00010880;
  ForceField *in_stack_00010888;
  ShapeAtomTypesSectionParser *in_stack_00010890;
  string *in_stack_fffffffffffffeb8;
  errorStruct *in_stack_fffffffffffffec0;
  StringTokenizer *in_stack_fffffffffffffed0;
  string *str;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  AtomType *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  ForceField *in_stack_ffffffffffffff20;
  AtomType *in_stack_ffffffffffffff30;
  allocator<char> local_99;
  StringTokenizer *in_stack_ffffffffffffff68;
  
  str = (string *)&local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),(char *)str,
             (allocator<char> *)in_RDX);
  StringTokenizer::StringTokenizer
            ((StringTokenizer *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),str,
             in_RDX);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::allocator<char>::~allocator(&local_99);
  iVar1 = StringTokenizer::countTokens(in_stack_fffffffffffffed0);
  if (iVar1 < 2) {
    in_stack_fffffffffffffec0 = &painCave;
    snprintf(painCave.errMsg,2000,
             "ShapesAtomTypesSectionParser Error: Not enough tokens at line %d\n",(ulong)in_ECX);
    *(undefined4 *)((long)in_stack_fffffffffffffec0->errMsg + 0x7d4) = 1;
    *(undefined4 *)((long)in_stack_fffffffffffffec0->errMsg + 2000) = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(in_stack_ffffffffffffff68);
    StringTokenizer::nextToken_abi_cxx11_(in_stack_ffffffffffffff68);
    pAVar2 = ForceField::getAtomType
                       ((ForceField *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        str);
    if (pAVar2 == (AtomType *)0x0) {
      pAVar2 = (AtomType *)operator_new(0xf8);
      AtomType::AtomType(in_stack_ffffffffffffff30);
      sVar3 = ForceField::getNAtomType((ForceField *)0x25d1fe);
      AtomType::setIdent(pAVar2,(int)sVar3 + 1);
      AtomType::setName((AtomType *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      ForceField::addAtomType
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    }
    parseShapeFile(in_stack_00010890,in_stack_00010888,in_stack_00010880,in_stack_00010878);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  }
  StringTokenizer::~StringTokenizer((StringTokenizer *)in_stack_fffffffffffffec0);
  return;
}

Assistant:

void ShapeAtomTypesSectionParser::parseLine(ForceField& ff,
                                              const std::string& line,
                                              int lineNo) {
    StringTokenizer tokenizer(line);

    if (tokenizer.countTokens() >= 2) {
      std::string shapeTypeName = tokenizer.nextToken();
      std::string shapeFile     = tokenizer.nextToken();

      AtomType* atomType = ff.getAtomType(shapeTypeName);
      if (atomType == NULL) {
        atomType  = new AtomType();
        int ident = ff.getNAtomType() + 1;
        atomType->setIdent(ident);
        atomType->setName(shapeTypeName);
        ff.addAtomType(shapeTypeName, atomType);
      }

      parseShapeFile(ff, shapeFile, atomType);

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ShapesAtomTypesSectionParser Error: "
               "Not enough tokens at line %d\n",
               lineNo);
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
  }